

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::BuildIntersectList(Clipper *this,cInt topY)

{
  bool bVar1;
  cInt cVar2;
  IntersectNode *this_00;
  IntersectNode *local_58;
  IntersectNode *newNode;
  cInt local_48;
  undefined1 local_40 [8];
  IntPoint Pt;
  TEdge *eNext;
  TEdge *pTStack_20;
  bool isModified;
  TEdge *e;
  cInt topY_local;
  Clipper *this_local;
  
  if (*(long *)(this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) != 0
     ) {
    pTStack_20 = *(TEdge **)
                  (this->_vptr_Clipper[-3] + 0x10 +
                  (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
    this->m_SortedEdges = pTStack_20;
    for (; pTStack_20 != (TEdge *)0x0; pTStack_20 = pTStack_20->NextInAEL) {
      pTStack_20->PrevInSEL = pTStack_20->PrevInAEL;
      pTStack_20->NextInSEL = pTStack_20->NextInAEL;
      cVar2 = TopX(pTStack_20,topY);
      (pTStack_20->Curr).X = cVar2;
    }
    do {
      bVar1 = false;
      pTStack_20 = this->m_SortedEdges;
      while (pTStack_20->NextInSEL != (TEdge *)0x0) {
        Pt.Y = (cInt)pTStack_20->NextInSEL;
        IntPoint::IntPoint((IntPoint *)local_40,0,0);
        if (*(long *)(Pt.Y + 0x10) < (pTStack_20->Curr).X) {
          IntersectPoint(pTStack_20,(TEdge *)Pt.Y,(IntPoint *)local_40);
          if (Pt.X < topY) {
            cVar2 = TopX(pTStack_20,topY);
            IntPoint::IntPoint((IntPoint *)&newNode,cVar2,topY);
            local_40 = (undefined1  [8])newNode;
            Pt.X = local_48;
          }
          this_00 = (IntersectNode *)operator_new(0x20);
          IntersectNode::IntersectNode(this_00);
          this_00->Edge1 = pTStack_20;
          this_00->Edge2 = (TEdge *)Pt.Y;
          (this_00->Pt).X = (cInt)local_40;
          (this_00->Pt).Y = Pt.X;
          local_58 = this_00;
          std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
          push_back(&this->m_IntersectList,&local_58);
          SwapPositionsInSEL(this,pTStack_20,(TEdge *)Pt.Y);
          bVar1 = true;
        }
        else {
          pTStack_20 = (TEdge *)Pt.Y;
        }
      }
    } while ((pTStack_20->PrevInSEL != (TEdge *)0x0) &&
            (pTStack_20->PrevInSEL->NextInSEL = (TEdge *)0x0, bVar1));
    this->m_SortedEdges = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::BuildIntersectList(const cInt topY)
{
  if ( !m_ActiveEdges ) return;

  //prepare for sorting ...
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  while( e )
  {
    e->PrevInSEL = e->PrevInAEL;
    e->NextInSEL = e->NextInAEL;
    e->Curr.X = TopX( *e, topY );
    e = e->NextInAEL;
  }

  //bubblesort ...
  bool isModified;
  do
  {
    isModified = false;
    e = m_SortedEdges;
    while( e->NextInSEL )
    {
      TEdge *eNext = e->NextInSEL;
      IntPoint Pt;
      if(e->Curr.X > eNext->Curr.X)
      {
        IntersectPoint(*e, *eNext, Pt);
        if (Pt.Y < topY) Pt = IntPoint(TopX(*e, topY), topY);
        IntersectNode * newNode = new IntersectNode;
        newNode->Edge1 = e;
        newNode->Edge2 = eNext;
        newNode->Pt = Pt;
        m_IntersectList.push_back(newNode);

        SwapPositionsInSEL(e, eNext);
        isModified = true;
      }
      else
        e = eNext;
    }
    if( e->PrevInSEL ) e->PrevInSEL->NextInSEL = 0;
    else break;
  }
  while ( isModified );
  m_SortedEdges = 0; //important
}